

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_name_tests.cpp
# Opt level: O2

void __thiscall
iu_RenameParamTest_x_iutest_x_Test_Test::Body(iu_RenameParamTest_x_iutest_x_Test_Test *this)

{
  TestInfo *pTVar1;
  string name;
  string local_208 [32];
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"Test/",(allocator<char> *)&local_190);
  iutest::
  WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::GetParam();
  std::__cxx11::string::append((string *)&name);
  std::__cxx11::string::string(local_208,(string *)&name);
  iutest::UnitTest::instance();
  pTVar1 = iutest::Test::GetCurrentTestInfo();
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            (&iutest_ar,(internal *)0x12b6b2,
             "::iutest::UnitTest::GetInstance()->current_test_info()->name()",(char *)local_208,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pTVar1->m_testname)._M_dataplus._M_p,
             (char *)&iutest_type_traits::enabler_t<void>::value,(type **)name._M_dataplus._M_p);
  std::__cxx11::string::~string(local_208);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_name_tests.cpp"
               ,0x47,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

IUTEST_P(RenameParamTest, Test)
{
    ::std::string name = "Test/";
    name += GetParam();
    IUTEST_ASSERT_STREQ(name, ::iutest::UnitTest::GetInstance()->current_test_info()->name());
}